

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspFacade::Statistics::ClingoView::ClingoView(ClingoView *this,ClaspFacade *f)

{
  bool bVar1;
  StatsMap *pSVar2;
  LpStats *pLVar3;
  undefined8 *puVar4;
  Accu *pAVar5;
  Summary *pSVar6;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  long in_RSI;
  undefined8 *in_RDI;
  SharedContext *in_stack_fffffffffffffdf8;
  Summary *in_stack_fffffffffffffe00;
  StepStats *this_00;
  Accu *in_stack_fffffffffffffe10;
  StatsMap *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  ClaspStatistics *in_stack_fffffffffffffe30;
  
  ClaspStatistics::ClaspStatistics
            ((ClaspStatistics *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  *in_RDI = &PTR__ClingoView_002dc228;
  StatsMap::StatsMap((StatsMap *)0x12360f);
  StatsMap::StatsMap((StatsMap *)0x12362a);
  Summary::Summary((Summary *)in_stack_fffffffffffffe10);
  SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
  SingleOwnerPtr((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                  *)(in_RDI + 0xd));
  pSVar2 = ClaspStatistics::makeRoot(in_stack_fffffffffffffe30);
  in_RDI[2] = pSVar2;
  StatisticObject::value<unsigned_int>((uint *)in_stack_fffffffffffffdf8);
  __len = (socklen_t)pSVar2;
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatisticObject::value<Clasp::SolveResult,_&Clasp::(anonymous_namespace)::_getResult>
            ((SolveResult *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatisticObject::value<Clasp::SolveResult,_&Clasp::(anonymous_namespace)::_getSignal>
            ((SolveResult *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatisticObject::value<Clasp::SolveResult,_&Clasp::(anonymous_namespace)::_getExhausted>
            ((SolveResult *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
            ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x12382d);
  StatisticObject::array<Clasp::ClaspFacade::SolveData::BoundArray>
            ((BoundArray *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
            ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x1238a8);
  StatisticObject::array<Clasp::ClaspFacade::SolveData::BoundArray>
            ((BoundArray *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatisticObject::value<Clasp::SharedContext,_&Clasp::(anonymous_namespace)::_getConcurrency>
            (in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatisticObject::value<Clasp::SharedContext,_&Clasp::(anonymous_namespace)::_getWinner>
            (in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StepStats::bind((StepStats *)(in_RDI + 9),(int)in_RSI + 0x128,__addr,__len);
  StepStats::addTo((StepStats *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                   in_stack_fffffffffffffe18);
  pLVar3 = ClaspFacade::Summary::lpStats(in_stack_fffffffffffffe00);
  if (pLVar3 != (LpStats *)0x0) {
    ClaspFacade::Summary::lpStats(in_stack_fffffffffffffe00);
    StatisticObject::map<Clasp::Asp::LpStats>((LpStats *)in_stack_fffffffffffffdf8);
    StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                  (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
    bVar1 = ClaspFacade::incremental((ClaspFacade *)0x123aa5);
    if (bVar1) {
      ClaspFacade::Summary::lpStep(in_stack_fffffffffffffe00);
      StatisticObject::map<Clasp::Asp::LpStats>((LpStats *)in_stack_fffffffffffffdf8);
      StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                    (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
    }
  }
  SharedContext::stats((SharedContext *)(in_RSI + 8));
  StatisticObject::map<Clasp::ProblemStats>((ProblemStats *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatsMap::toStats((StatsMap *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatsMap::toStats((StatsMap *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  StatsMap::toStats((StatsMap *)in_stack_fffffffffffffdf8);
  StatsMap::add((StatsMap *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                (char *)in_stack_fffffffffffffe18,(StatisticObject *)in_stack_fffffffffffffe10);
  bVar1 = ClaspFacade::incremental((ClaspFacade *)0x123cfa);
  if (bVar1) {
    puVar4 = (undefined8 *)operator_new(0x40);
    puVar4[6] = 0;
    puVar4[7] = 0;
    puVar4[4] = 0;
    puVar4[5] = 0;
    puVar4[2] = 0;
    puVar4[3] = 0;
    *puVar4 = 0;
    puVar4[1] = 0;
    Accu::Accu(in_stack_fffffffffffffe10);
    SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::operator=
              ((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                *)in_stack_fffffffffffffe00,(Accu *)in_stack_fffffffffffffdf8);
    pAVar5 = SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>::
             operator->((SingleOwnerPtr<Clasp::ClaspFacade::Statistics::ClingoView::Accu,_Clasp::DeleteObject>
                         *)0x123d65);
    this_00 = &pAVar5->step;
    pSVar6 = SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject>::get
                       ((SingleOwnerPtr<Clasp::ClaspFacade::Summary,_Clasp::DeleteObject> *)0x123d8e
                       );
    StepStats::bind(this_00,(int)pSVar6,__addr_00,__len);
  }
  return;
}

Assistant:

ClaspFacade::Statistics::ClingoView::ClingoView(const ClaspFacade& f) {
	keys_ = makeRoot();
	summary_.add("call"       , StatisticObject::value(&f.step_.step));
	summary_.add("result"     , StatisticObject::value<SolveResult, _getResult>(&f.step_.result));
	summary_.add("signal"     , StatisticObject::value<SolveResult, _getSignal>(&f.step_.result));
	summary_.add("exhausted"  , StatisticObject::value<SolveResult, _getExhausted>(&f.step_.result));
	summary_.add("costs"      , StatisticObject::array(&f.solve_->costs));
	summary_.add("lower"      , StatisticObject::array(&f.solve_->lower));
	summary_.add("concurrency", StatisticObject::value<SharedContext, _getConcurrency>(&f.ctx));
	summary_.add("winner"     , StatisticObject::value<SharedContext, _getWinner>(&f.ctx));
	summary_.step.bind(f.step_);
	summary_.step.addTo(summary_);
	if (f.step_.lpStats()) {
		problem_.add("lp", StatisticObject::map(f.step_.lpStats()));
		if (f.incremental()) { problem_.add("lpStep", StatisticObject::map(f.step_.lpStep())); }
	}
	problem_.add("generator", StatisticObject::map(&f.ctx.stats()));
	keys_->add("problem", problem_.toStats());
	keys_->add("solving", solving_.toStats());
	keys_->add("summary", summary_.toStats());

	if (f.incremental()) {
		accu_ = new Accu();
		accu_->step.bind(*f.accu_.get());
	}
}